

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioutils.cpp
# Opt level: O1

bool QMakeInternal::IoUtils::touchFile
               (QString *targetFileName,QString *referenceFileName,QString *errorString)

{
  char *pcVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  storage_type *psVar7;
  storage_type *psVar8;
  char16_t *pcVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  stat st;
  QString local_138;
  QString local_120;
  QString local_108;
  type local_e8;
  long lStack_d0;
  stat local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c8,0xaa,0x90);
  QString::toLocal8Bit_helper((QChar *)&local_e8,(longlong)(referenceFileName->d).ptr);
  pcVar9 = local_e8.d.ptr;
  if (local_e8.d.ptr == (char16_t *)0x0) {
    pcVar9 = (char16_t *)&QByteArray::_empty;
  }
  iVar4 = stat((char *)pcVar9,&local_c8);
  if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (iVar4 == 0) {
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = (char16_t *)0x3fffffff;
    local_e8.d.size = local_c8.st_mtim.tv_sec;
    lStack_d0 = local_c8.st_mtim.tv_nsec;
    QString::toLocal8Bit_helper((QChar *)&local_108,(longlong)(targetFileName->d).ptr);
    pcVar9 = local_108.d.ptr;
    if (local_108.d.ptr == (char16_t *)0x0) {
      pcVar9 = (char16_t *)&QByteArray::_empty;
    }
    iVar4 = utimensat(-100,(char *)pcVar9,(timespec *)&local_e8,0);
    bVar10 = -1 < iVar4;
    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
      }
    }
    if (iVar4 < 0) {
      QVar12.m_data = (storage_type *)0x14;
      QVar12.m_size = (qsizetype)&local_120;
      QString::fromLatin1(QVar12);
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      if (pcVar6 == (char *)0x0) {
        psVar8 = (storage_type *)0x0;
      }
      else {
        psVar7 = (storage_type *)0xffffffffffffffff;
        do {
          psVar8 = psVar7 + 1;
          pcVar1 = pcVar6 + 1 + (long)psVar7;
          psVar7 = psVar8;
        } while (*pcVar1 != '\0');
      }
      QVar14.m_data = psVar8;
      QVar14.m_size = (qsizetype)&local_138;
      QString::fromLatin1(QVar14);
      QString::arg<QString_const&,QString>(&local_108,&local_120,targetFileName,&local_138);
      pQVar2 = &((errorString->d).d)->super_QArrayData;
      pcVar9 = (errorString->d).ptr;
      (errorString->d).d = local_108.d.d;
      (errorString->d).ptr = local_108.d.ptr;
      qVar3 = (errorString->d).size;
      (errorString->d).size = local_108.d.size;
      local_108.d.d = (Data *)pQVar2;
      local_108.d.ptr = pcVar9;
      local_108.d.size = qVar3;
      if (pQVar2 != (QArrayData *)0x0) {
        LOCK();
        (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar2,2,0x10);
        }
      }
      if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  else {
    QVar11.m_data = (storage_type *)0x24;
    QVar11.m_size = (qsizetype)&local_108;
    QString::fromLatin1(QVar11);
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    if (pcVar6 == (char *)0x0) {
      psVar8 = (storage_type *)0x0;
    }
    else {
      psVar7 = (storage_type *)0xffffffffffffffff;
      do {
        psVar8 = psVar7 + 1;
        pcVar1 = pcVar6 + 1 + (long)psVar7;
        psVar7 = psVar8;
      } while (*pcVar1 != '\0');
    }
    QVar13.m_data = psVar8;
    QVar13.m_size = (qsizetype)&local_120;
    QString::fromLatin1(QVar13);
    QString::arg<QString_const&,QString>(&local_e8,&local_108,referenceFileName,&local_120);
    pQVar2 = &((errorString->d).d)->super_QArrayData;
    pcVar9 = (errorString->d).ptr;
    (errorString->d).d = local_e8.d.d;
    (errorString->d).ptr = local_e8.d.ptr;
    qVar3 = (errorString->d).size;
    (errorString->d).size = local_e8.d.size;
    local_e8.d.d = (Data *)pQVar2;
    local_e8.d.ptr = pcVar9;
    local_e8.d.size = qVar3;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    if (&(local_120.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_120.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_120.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar10 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool IoUtils::touchFile(const QString &targetFileName, const QString &referenceFileName, QString *errorString)
{
#  ifdef Q_OS_UNIX
    struct stat st;
    if (stat(referenceFileName.toLocal8Bit().constData(), &st)) {
        *errorString = fL1S("Cannot stat() reference file %1: %2.").arg(referenceFileName, fL1S(strerror(errno)));
        return false;
    }
#    if (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    const struct timespec times[2] = { { 0, UTIME_NOW },
#      if defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L
        st.st_mtim // POSIX.1-2008
#      else
        st.st_mtimespec // Darwin
#      endif
    };
    const bool utimeError = utimensat(AT_FDCWD, targetFileName.toLocal8Bit().constData(), times, 0) < 0;
#    else
    struct utimbuf utb;
    utb.actime = time(0);
    utb.modtime = st.st_mtime;
    const bool utimeError= utime(targetFileName.toLocal8Bit().constData(), &utb) < 0;
#    endif // (defined(_POSIX_VERSION) && _POSIX_VERSION >= 200809L) || defined(Q_OS_DARWIN)
    if (utimeError) {
        *errorString = fL1S("Cannot touch %1: %2.").arg(targetFileName, fL1S(strerror(errno)));
        return false;
    }
#  else
    HANDLE rHand = CreateFile((wchar_t*)referenceFileName.utf16(),
                              GENERIC_READ, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (rHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open reference file %1: %2")
            .arg(referenceFileName, QSystemError::windowsString());
        return false;
        }
    FILETIME ft;
    GetFileTime(rHand, NULL, NULL, &ft);
    CloseHandle(rHand);
    HANDLE wHand = CreateFile((wchar_t*)targetFileName.utf16(),
                              GENERIC_WRITE, FILE_SHARE_READ,
                              NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (wHand == INVALID_HANDLE_VALUE) {
        *errorString = fL1S("Cannot open %1: %2")
            .arg(targetFileName, QSystemError::windowsString());
        return false;
    }
    SetFileTime(wHand, NULL, NULL, &ft);
    CloseHandle(wHand);
#  endif // Q_OS_UNIX
    return true;
}